

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Maybe<kj::Own<kj::_::Event>_> __thiscall kj::_::ExclusiveJoinPromiseNode::Branch::fire(Branch *this)

{
  Type *in_RDX;
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event>_> MVar1;
  kj local_2e8 [8];
  Maybe<kj::Exception> local_2e0;
  kj local_180 [8];
  Maybe<kj::Exception> local_178;
  Branch *this_local;
  
  this_local = this;
  if (in_RSI == *(long *)(in_RSI + 0x28) + 8) {
    runCatchingExceptions<kj::_::ExclusiveJoinPromiseNode::Branch::fire()::__0>
              (&local_178,local_180,(Type *)in_RDX);
    Maybe<kj::Exception>::~Maybe(&local_178);
  }
  else {
    runCatchingExceptions<kj::_::ExclusiveJoinPromiseNode::Branch::fire()::__1>
              (&local_2e0,local_2e8,in_RDX);
    Maybe<kj::Exception>::~Maybe(&local_2e0);
  }
  PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(*(long *)(in_RSI + 0x28) + 0x88));
  Maybe<kj::Own<kj::_::Event>_>::Maybe((Maybe<kj::Own<kj::_::Event>_> *)this,(void *)0x0);
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<Event>> ExclusiveJoinPromiseNode::Branch::fire() {
  // Cancel the branch that didn't return first.  Ignore exceptions caused by cancellation.
  if (this == &joinNode.left) {
    kj::runCatchingExceptions([&]() { joinNode.right.dependency = nullptr; });
  } else {
    kj::runCatchingExceptions([&]() { joinNode.left.dependency = nullptr; });
  }

  joinNode.onReadyEvent.arm();
  return nullptr;
}